

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_allocator.h
# Opt level: O2

void * __thiscall
iffl::debug_memory_resource::do_allocate(debug_memory_resource *this,size_t bytes,size_t alignment)

{
  size_t *psVar1;
  void *pvVar2;
  undefined8 *puVar3;
  
  psVar1 = (size_t *)malloc(bytes + 0x28);
  if (psVar1 != (size_t *)0x0) {
    *psVar1 = bytes + 0x28;
    psVar1[1] = alignment;
    psVar1[2] = (size_t)this;
    psVar1[3] = 0xbeefabcd;
    *(undefined8 *)((long)psVar1 + bytes + 0x20) = 0xdeadabcd;
    LOCK();
    (this->busy_blocks_count_).super___atomic_base<unsigned_long>._M_i =
         (this->busy_blocks_count_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    pvVar2 = memset(psVar1 + 4,0xfe,bytes);
    return pvVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = operator_new;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* do_allocate(size_t bytes, [[maybe_unused]] size_t alignment) override {

        size_t bytes_with_debug_info = bytes + min_allocation_size;
        void *ptr = FFL_ALLIGNED_ALLOC(bytes_with_debug_info, alignment);
        if (nullptr == ptr) {
            throw std::bad_alloc{};
        }

        prefix_t *prefix{ static_cast<prefix_t *>(ptr) };
        suffix_t *suffix{ reinterpret_cast<suffix_t *>( static_cast<char *>(ptr) + bytes_with_debug_info) - 1 };

        prefix->size = bytes_with_debug_info;
        prefix->alignment = alignment;
        prefix->memory_resource = this;
        prefix->pattern = busy_block_prefix_pattern;
        suffix->pattern = busy_block_suffix_pattern;

        increment_busy_block_count();

        char *user_buffer = reinterpret_cast<char *>(prefix + 1);
        fill_buffer(user_buffer, fill_pattern, bytes);

        return user_buffer;
    }